

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void handle_file_based_request(mg_connection *conn,char *path,mg_file *file)

{
  int iVar1;
  ptrdiff_t pVar2;
  mg_file *file_local;
  char *path_local;
  mg_connection *conn_local;
  
  if ((conn != (mg_connection *)0x0) && (conn->dom_ctx != (mg_domain_context *)0x0)) {
    pVar2 = match_prefix_strlen(conn->dom_ctx->config[0x20],path);
    if (pVar2 < 1) {
      handle_static_file_request(conn,path,file,(char *)0x0,(char *)0x0);
    }
    else {
      iVar1 = is_in_script_path(conn,path);
      if (iVar1 == 0) {
        mg_send_http_error(conn,0x193,"%s","Forbidden");
      }
      else {
        handle_ssi_file_request(conn,path,file);
      }
    }
  }
  return;
}

Assistant:

static void
handle_file_based_request(struct mg_connection *conn,
                          const char *path,
                          struct mg_file *file)
{
#if !defined(NO_CGI)
	int cgi_config_idx, inc, max;
#endif

	if (!conn || !conn->dom_ctx) {
		return;
	}

#if defined(USE_LUA)
	if (match_prefix_strlen(conn->dom_ctx->config[LUA_SERVER_PAGE_EXTENSIONS],
	                        path)
	    > 0) {
		if (is_in_script_path(conn, path)) {
			/* Lua server page: an SSI like page containing mostly plain
			 * html code plus some tags with server generated contents. */
			handle_lsp_request(conn, path, file, NULL);
		} else {
			/* Script was in an illegal path */
			mg_send_http_error(conn, 403, "%s", "Forbidden");
		}
		return;
	}

	if (match_prefix_strlen(conn->dom_ctx->config[LUA_SCRIPT_EXTENSIONS], path)
	    > 0) {
		if (is_in_script_path(conn, path)) {
			/* Lua in-server module script: a CGI like script used to
			 * generate the entire reply. */
			mg_exec_lua_script(conn, path, NULL);
		} else {
			/* Script was in an illegal path */
			mg_send_http_error(conn, 403, "%s", "Forbidden");
		}
		return;
	}
#endif

#if defined(USE_DUKTAPE)
	if (match_prefix_strlen(conn->dom_ctx->config[DUKTAPE_SCRIPT_EXTENSIONS],
	                        path)
	    > 0) {
		if (is_in_script_path(conn, path)) {
			/* Call duktape to generate the page */
			mg_exec_duktape_script(conn, path);
		} else {
			/* Script was in an illegal path */
			mg_send_http_error(conn, 403, "%s", "Forbidden");
		}
		return;
	}
#endif

#if !defined(NO_CGI)
	inc = CGI2_EXTENSIONS - CGI_EXTENSIONS;
	max = PUT_DELETE_PASSWORDS_FILE - CGI_EXTENSIONS;
	for (cgi_config_idx = 0; cgi_config_idx < max; cgi_config_idx += inc) {
		if (conn->dom_ctx->config[CGI_EXTENSIONS + cgi_config_idx] != NULL) {
			if (match_prefix_strlen(
			        conn->dom_ctx->config[CGI_EXTENSIONS + cgi_config_idx],
			        path)
			    > 0) {
				if (is_in_script_path(conn, path)) {
					/* CGI scripts may support all HTTP methods */
					handle_cgi_request(conn, path, cgi_config_idx);
				} else {
					/* Script was in an illegal path */
					mg_send_http_error(conn, 403, "%s", "Forbidden");
				}
				return;
			}
		}
	}
#endif /* !NO_CGI */

	if (match_prefix_strlen(conn->dom_ctx->config[SSI_EXTENSIONS], path) > 0) {
		if (is_in_script_path(conn, path)) {
			handle_ssi_file_request(conn, path, file);
		} else {
			/* Script was in an illegal path */
			mg_send_http_error(conn, 403, "%s", "Forbidden");
		}
		return;
	}

#if !defined(NO_CACHING)
	if ((!conn->in_error_handler) && is_not_modified(conn, &file->stat)) {
		/* Send 304 "Not Modified" - this must not send any body data */
		handle_not_modified_static_file_request(conn, file);
		return;
	}
#endif /* !NO_CACHING */

	handle_static_file_request(conn, path, file, NULL, NULL);
}